

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

int __thiscall luna::CodeGenerateVisitor::PrepareUpvalue(CodeGenerateVisitor *this,String *name)

{
  Function *pFVar1;
  GenerateFunction *__args;
  String *pSVar2;
  int iVar3;
  int iVar4;
  _Elt_pointer ppGVar5;
  iterator iVar6;
  CodeGenerateException *pCVar7;
  bool parent_local;
  anon_union_16_2_eed97686_for_String_2 *paVar8;
  GenerateBlock *pGVar9;
  stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
  parents;
  _Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_> local_98;
  Function *local_40;
  String *local_38;
  
  pFVar1 = this->current_function_->function_;
  iVar3 = Function::SearchUpvalue(pFVar1,name);
  if (-1 < iVar3) {
    return iVar3;
  }
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::
  _M_initialize_map(&local_98,0);
  local_40 = pFVar1;
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>::
    _M_push_back_aux<luna::GenerateFunction*const&>
              ((deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>> *)&local_98,
               &this->current_function_->parent_);
  }
  else {
    *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = this->current_function_->parent_;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar3 = -1;
    parent_local = false;
    do {
      ppGVar5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppGVar5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      __args = ppGVar5[-1];
      if (__args == (GenerateFunction *)0x0) {
        __assert_fail("current",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x157,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
      }
      if (iVar3 < 0) {
        pGVar9 = (GenerateBlock *)&__args->current_block_;
        local_38 = name;
        do {
          pGVar9 = pGVar9->parent_;
          if (pGVar9 == (GenerateBlock *)0x0) {
            iVar4 = Function::SearchUpvalue(__args->function_,name);
            if (iVar4 < 0) {
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>::
                _M_push_back_aux<luna::GenerateFunction*const&>
                          ((deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>> *
                           )&local_98,&__args->parent_);
              }
              else {
                *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = __args->parent_;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
            else {
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_98._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_98._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_98._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
              parent_local = false;
              iVar3 = iVar4;
            }
            goto LAB_00162dc1;
          }
          iVar6 = std::
                  _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(pGVar9->names_)._M_h,&local_38);
        } while (iVar6.
                 super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                 ._M_cur == (__node_type *)0x0);
        iVar3 = *(int *)((long)iVar6.
                               super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                               ._M_cur + 0x10);
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_98._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_98._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        parent_local = true;
      }
      else {
        iVar3 = Function::AddUpvalue(__args->function_,name,parent_local,iVar3);
        if (0xf9 < iVar3) {
          pCVar7 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
          pSVar2 = __args->function_->module_;
          if ((pSVar2->super_GCObject).field_0x11 == '\0') {
            paVar8 = &pSVar2->field_1;
          }
          else {
            paVar8 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar2->field_1).str_;
          }
          CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                    (pCVar7,paVar8->str_buffer_,__args->function_->line_,
                     (char (*) [30])"too many upvalues in function");
          __cxa_throw(pCVar7,&CodeGenerateException::typeinfo,Exception::~Exception);
        }
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_98._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_98._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        parent_local = false;
      }
LAB_00162dc1:
      pFVar1 = local_40;
    } while (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_98._M_impl.super__Deque_impl_data._M_start._M_cur);
    if (-1 < iVar3) {
      iVar3 = Function::AddUpvalue(local_40,name,parent_local,iVar3);
      if (iVar3 < 0xfa) {
        std::_Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::
        ~_Deque_base(&local_98);
        return iVar3;
      }
      pCVar7 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
      pSVar2 = pFVar1->module_;
      if ((pSVar2->super_GCObject).field_0x11 == '\0') {
        paVar8 = &pSVar2->field_1;
      }
      else {
        paVar8 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar2->field_1).str_;
      }
      CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                (pCVar7,paVar8->str_buffer_,pFVar1->line_,
                 (char (*) [30])"too many upvalues in function");
      __cxa_throw(pCVar7,&CodeGenerateException::typeinfo,Exception::~Exception);
    }
  }
  __assert_fail("register_index >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x184,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
}

Assistant:

int PrepareUpvalue(String *name) const
        {
            // If the upvalue info existed, then return the index of the upvalue
            auto function = GetCurrentFunction();
            auto index = function->SearchUpvalue(name);
            if (index >= 0)
                return index;

            // Search start from parent
            std::stack<GenerateFunction *> parents;
            parents.push(current_function_->parent_);

            int register_index = -1;
            bool parent_local = false;
            while (!parents.empty())
            {
                auto current = parents.top();
                assert(current);
                if (register_index >= 0)
                {
                    // Find it, add it as upvalue to function,
                    // and continue backtrack
                    auto index = current->function_->AddUpvalue(name, parent_local,
                                                                register_index);
                    CHECK_UPVALUE_MAX_COUNT(index, current->function_);
                    register_index = index;
                    parent_local = false;
                    parents.pop();
                }
                else
                {
                    // Find name from local names
                    auto name_info = SearchFunctionLocalName(current, name);
                    if (name_info)
                    {
                        // Find it, get its register_id and start backtrack
                        register_index = name_info->register_id_;
                        parent_local = true;
                        parents.pop();
                    }
                    else
                    {
                        // Find it from current function upvalue list
                        auto index = current->function_->SearchUpvalue(name);
                        if (index >= 0)
                        {
                            // Find it, the name upvalue has been inserted,
                            // then get the upvalue index, and start backtrack
                            register_index = index;
                            parent_local = false;
                            parents.pop();
                        }
                        else
                        {
                            // Not find it, continue to search its parent
                            parents.push(current->parent_);
                        }
                    }
                }
            }

            // Add it as upvalue to current function
            assert(register_index >= 0);
            index = function->AddUpvalue(name, parent_local, register_index);
            CHECK_UPVALUE_MAX_COUNT(index, function);
            return index;
        }